

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void merge_colors(uint16_t *colors,uint16_t *cached_colors,int n_colors,int n_cached_colors)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  
  if (0 < n_colors && n_cached_colors != 0) {
    uVar2 = 0;
    iVar4 = 0;
    iVar3 = n_cached_colors;
    do {
      if (iVar4 < n_cached_colors) {
        uVar5 = cached_colors[iVar4];
        if ((iVar3 < n_colors) && (uVar1 = colors[iVar3], colors[iVar3] < uVar5)) goto LAB_002a067d;
        iVar4 = iVar4 + 1;
      }
      else {
        uVar1 = colors[iVar3];
LAB_002a067d:
        uVar5 = uVar1;
        iVar3 = iVar3 + 1;
      }
      colors[uVar2] = uVar5;
      uVar2 = uVar2 + 1;
    } while ((uint)n_colors != uVar2);
  }
  return;
}

Assistant:

static void merge_colors(uint16_t *colors, uint16_t *cached_colors,
                         int n_colors, int n_cached_colors) {
  if (n_cached_colors == 0) return;
  int cache_idx = 0, trans_idx = n_cached_colors;
  for (int i = 0; i < n_colors; ++i) {
    if (cache_idx < n_cached_colors &&
        (trans_idx >= n_colors ||
         cached_colors[cache_idx] <= colors[trans_idx])) {
      colors[i] = cached_colors[cache_idx++];
    } else {
      assert(trans_idx < n_colors);
      colors[i] = colors[trans_idx++];
    }
  }
}